

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O3

string * __thiscall gflags::XMLText(string *__return_storage_ptr__,gflags *this,string *txt)

{
  ulong uVar1;
  ulong uVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&txt->_M_dataplus);
  uVar2 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x12a208,uVar2);
    if (uVar1 == 0xffffffffffffffff) break;
    uVar2 = uVar1 + 1;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1,0x12a20a);
  }
  uVar2 = 0;
  while( true ) {
    uVar1 = std::__cxx11::string::find((char *)__return_storage_ptr__,0x12a210,uVar2);
    if (uVar1 == 0xffffffffffffffff) break;
    uVar2 = uVar1 + 1;
    std::__cxx11::string::replace((ulong)__return_storage_ptr__,uVar1,(char *)0x1,0x12a212);
  }
  return (string *)0xffffffffffffffff;
}

Assistant:

static string XMLText(const string& txt) {
  string ans = txt;
  for (string::size_type pos = 0; (pos = ans.find("&", pos)) != string::npos; )
    ans.replace(pos++, 1, "&amp;");
  for (string::size_type pos = 0; (pos = ans.find("<", pos)) != string::npos; )
    ans.replace(pos++, 1, "&lt;");
  return ans;
}